

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

int uv_cond_init(uv_cond_t *cond)

{
  int local_20;
  pthread_condattr_t local_1c;
  int err;
  pthread_condattr_t attr;
  uv_cond_t *cond_local;
  
  _err = (pthread_cond_t *)cond;
  local_20 = pthread_condattr_init(&local_1c);
  if (local_20 == 0) {
    local_20 = pthread_condattr_setclock(&local_1c,1);
    if ((local_20 == 0) && (local_20 = pthread_cond_init(_err,&local_1c), local_20 == 0)) {
      local_20 = pthread_condattr_destroy(&local_1c);
      if (local_20 == 0) {
        return 0;
      }
      pthread_cond_destroy(_err);
    }
    pthread_condattr_destroy(&local_1c);
  }
  cond_local._4_4_ = -local_20;
  return cond_local._4_4_;
}

Assistant:

int uv_cond_init(uv_cond_t* cond) {
  pthread_condattr_t attr;
  int err;

  err = pthread_condattr_init(&attr);
  if (err)
    return -err;

#if !(defined(__ANDROID__) && defined(HAVE_PTHREAD_COND_TIMEDWAIT_MONOTONIC))
  err = pthread_condattr_setclock(&attr, CLOCK_MONOTONIC);
  if (err)
    goto error2;
#endif

  err = pthread_cond_init(cond, &attr);
  if (err)
    goto error2;

  err = pthread_condattr_destroy(&attr);
  if (err)
    goto error;

  return 0;

error:
  pthread_cond_destroy(cond);
error2:
  pthread_condattr_destroy(&attr);
  return -err;
}